

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::
       map_caster<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>,long,long>
       ::
       cast<std::unordered_map<long,long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,long>>>const&>
                 (SequenceDistanceGraph *src,return_value_policy policy,handle parent)

{
  handle hVar1;
  pointer pLVar2;
  dict d;
  object value;
  object key;
  handle local_70;
  handle local_68;
  object local_60;
  object local_58 [2];
  handle local_48;
  handle local_40;
  object local_38;
  
  dict::dict((dict *)&local_70);
  pLVar2 = (pointer)(src->super_DistanceGraph).links.
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar2 != (pointer)0x0) {
    do {
      local_60.super_handle.m_ptr = (handle)PyLong_FromSsize_t(pLVar2->dest);
      local_68.m_ptr = (PyObject *)PyLong_FromSsize_t(*(undefined8 *)&pLVar2->dist);
      if ((local_60.super_handle.m_ptr == (PyObject *)0x0) || (local_68.m_ptr == (PyObject *)0x0)) {
        object::~object((object *)&local_68);
        object::~object(&local_60);
        hVar1.m_ptr = (PyObject *)0x0;
        goto LAB_001f7761;
      }
      *(long *)local_60.super_handle.m_ptr = *(long *)local_60.super_handle.m_ptr + 1;
      local_48.m_ptr = local_70.m_ptr;
      local_40 = local_60.super_handle.m_ptr;
      local_58[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      object::~object(local_58);
      accessor_policies::generic_item::set(local_48,local_40,local_68);
      object::~object(&local_38);
      object::~object((object *)&local_40);
      object::~object((object *)&local_68);
      object::~object(&local_60);
      pLVar2 = (((_Vector_base<Link,_std::allocator<Link>_> *)&pLVar2->source)->_M_impl).
               super__Vector_impl_data._M_start;
    } while (pLVar2 != (pointer)0x0);
  }
  hVar1.m_ptr = local_70.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
LAB_001f7761:
  object::~object((object *)&local_70);
  return (handle)hVar1.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }